

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crl.cc
# Opt level: O0

CRLRevocationStatus
bssl::CheckCRL(string_view raw_crl,ParsedCertificateList *valid_chain,size_t target_cert_index,
              ParsedDistributionPoint *cert_dp,int64_t verify_time_epoch_seconds,
              optional<long> max_age_seconds)

{
  SignatureAlgorithm SVar1;
  Input signed_data;
  Input name_tlv;
  Input algorithm_identifier;
  Input algorithm_identifier_00;
  ParsedCertificate *pPVar2;
  size_t sVar3;
  bool bVar4;
  size_type sVar5;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *this;
  SignatureAlgorithm *pSVar7;
  Span<const_unsigned_char> *pSVar8;
  pointer pGVar9;
  ParsedBasicConstraints *pPVar10;
  ParsedCertificate *pPVar11;
  BitString *pBVar12;
  ParsedTbsCertificate *pPVar13;
  ParsedCrlTbsCertList *out;
  char *extraout_RDX;
  optional<bssl::der::Input> *revoked_certificates_tlv;
  Span<const_unsigned_char> SVar14;
  undefined1 auVar15 [16];
  Input IVar16;
  string_view s;
  Input tbs_tlv;
  string_view s_00;
  Input oid;
  Input extension_value;
  string_view s_01;
  Input cert_serial;
  optional<long> max_age_seconds_00;
  byte local_439;
  GeneralizedTime *local_3e8;
  Span<const_unsigned_char> local_338;
  element_type *local_328;
  ParsedCertificate *issuer_cert;
  size_t i;
  pair<const_bssl::der::Input,_bssl::ParsedExtension> *ext;
  iterator __end2;
  iterator __begin2;
  map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
  *__range2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2f0;
  byte local_2d1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2d0;
  size_t local_2b8;
  uchar *puStack_2b0;
  undefined1 local_29c [8];
  ContainedCertsType only_contains_cert_type;
  unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> distribution_point_names;
  Input local_280;
  ParsedExtension idp_extension;
  undefined1 local_238 [8];
  map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
  extensions;
  Span<const_unsigned_char> local_1d8;
  size_t local_1c8;
  uchar *puStack_1c0;
  undefined1 local_1b8 [8];
  string normalized_crl_issuer;
  _Optional_payload_base<bssl::SignatureAlgorithm> local_170;
  optional<bssl::SignatureAlgorithm> tbs_alg;
  _Optional_payload_base<bssl::SignatureAlgorithm> local_150;
  optional<bssl::SignatureAlgorithm> signature_algorithm;
  undefined1 local_120 [8];
  ParsedCrlTbsCertList tbs_cert_list;
  Input local_90;
  undefined1 local_80 [8];
  BitString signature_value;
  Input signature_algorithm_tlv;
  Input tbs_cert_list_tlv;
  ParsedCertificate *target_cert;
  int64_t verify_time_epoch_seconds_local;
  ParsedDistributionPoint *cert_dp_local;
  size_t target_cert_index_local;
  ParsedCertificateList *valid_chain_local;
  string_view raw_crl_local;
  
  s._M_len = raw_crl._M_str;
  pBVar12 = (BitString *)verify_time_epoch_seconds;
  sVar5 = ::std::
          vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ::size(valid_chain);
  if (sVar5 <= target_cert_index) {
    abort();
  }
  bVar4 = ::std::optional::operator_cast_to_bool((optional *)&cert_dp->reasons);
  if (bVar4) {
    return MAX_VALUE;
  }
  bVar4 = ::std::optional::operator_cast_to_bool((optional *)&cert_dp->crl_issuer);
  if (bVar4) {
    return MAX_VALUE;
  }
  p_Var6 = &::std::
            vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ::operator[](valid_chain,target_cert_index)->
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>;
  this = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::get(p_Var6)
  ;
  der::Input::Input((Input *)&signature_algorithm_tlv.data_.size_);
  der::Input::Input((Input *)&signature_value.unused_bits_);
  der::BitString::BitString((BitString *)local_80);
  s._M_str = extraout_RDX;
  tbs_cert_list.crl_extensions_tlv.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
  super__Optional_payload_base<bssl::der::Input>._16_8_ = (bssl *)raw_crl._M_len;
  SVar14 = StringAsBytes((bssl *)raw_crl._M_len,s);
  der::Input::Input(&local_90,SVar14);
  out = (ParsedCrlTbsCertList *)&signature_value.unused_bits_;
  IVar16.data_.size_ = (size_t)&signature_algorithm_tlv.data_.size_;
  IVar16.data_.data_ = (uchar *)local_90.data_.size_;
  bVar4 = ParseCrlCertificateList
                    ((bssl *)local_90.data_.data_,IVar16,(Input *)out,(Input *)local_80,pBVar12);
  if (!bVar4) {
    return MAX_VALUE;
  }
  ParsedCrlTbsCertList::ParsedCrlTbsCertList((ParsedCrlTbsCertList *)local_120);
  tbs_tlv.data_.size_ = (size_t)local_120;
  tbs_tlv.data_.data_ = tbs_cert_list_tlv.data_.data_;
  bVar4 = ParseCrlTbsCertList((bssl *)signature_algorithm_tlv.data_.size_,tbs_tlv,out);
  if (!bVar4) {
    raw_crl_local._M_str._4_4_ = MAX_VALUE;
    signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
    super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value = kRsaPkcs1Sha256;
    goto LAB_005db7d5;
  }
  tbs_alg.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
  super__Optional_payload_base<bssl::SignatureAlgorithm> =
       (_Optional_base<bssl::SignatureAlgorithm,_true,_true>)
       (_Optional_base<bssl::SignatureAlgorithm,_true,_true>)signature_value._16_8_;
  algorithm_identifier_00.data_.size_ = (size_t)signature_algorithm_tlv.data_.data_;
  algorithm_identifier_00.data_.data_ = (uchar *)signature_value._16_8_;
  local_150 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
              ParseSignatureAlgorithm(algorithm_identifier_00);
  bVar4 = ::std::optional::operator_cast_to_bool((optional *)&local_150);
  if (!bVar4) {
    raw_crl_local._M_str._4_4_ = MAX_VALUE;
    signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
    super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value = kRsaPkcs1Sha256;
    goto LAB_005db7d5;
  }
  algorithm_identifier.data_.size_ = (size_t)tbs_cert_list.signature_algorithm_tlv.data_.data_;
  algorithm_identifier.data_.data_ = (uchar *)tbs_cert_list._0_8_;
  local_170 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
              ParseSignatureAlgorithm(algorithm_identifier);
  bVar4 = ::std::optional::operator_cast_to_bool((optional *)&local_170);
  if (bVar4) {
    pSVar7 = ::std::optional<bssl::SignatureAlgorithm>::operator*
                       ((optional<bssl::SignatureAlgorithm> *)&local_150);
    SVar1 = *pSVar7;
    pSVar7 = ::std::optional<bssl::SignatureAlgorithm>::operator*
                       ((optional<bssl::SignatureAlgorithm> *)&local_170);
    if (SVar1 == *pSVar7) {
      bVar4 = ::std::optional<bssl::der::GeneralizedTime>::has_value
                        ((optional<bssl::der::GeneralizedTime> *)&tbs_cert_list.this_update);
      if (bVar4) {
        local_3e8 = ::std::optional<bssl::der::GeneralizedTime>::value
                              ((optional<bssl::der::GeneralizedTime> *)&tbs_cert_list.this_update);
      }
      else {
        local_3e8 = (GeneralizedTime *)0x0;
      }
      normalized_crl_issuer.field_2._8_8_ =
           max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value =
           max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._8_8_ & 0xffffffff;
      max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = pBVar12;
      bVar4 = CheckRevocationDateValid
                        ((bssl *)&tbs_cert_list.issuer_tlv.data_.size_,local_3e8,
                         (GeneralizedTime *)verify_time_epoch_seconds,
                         max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long>._M_payload._M_value,max_age_seconds_00);
      if (!bVar4) {
        raw_crl_local._M_str._4_4_ = MAX_VALUE;
        signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
        super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value = kRsaPkcs1Sha256
        ;
        goto LAB_005db7d5;
      }
      ::std::__cxx11::string::string((string *)local_1b8);
      local_1c8 = tbs_cert_list.signature_algorithm_tlv.data_.size_;
      puStack_1c0 = tbs_cert_list.issuer_tlv.data_.data_;
      name_tlv.data_.size_ = (size_t)tbs_cert_list.issuer_tlv.data_.data_;
      name_tlv.data_.data_ = (uchar *)tbs_cert_list.signature_algorithm_tlv.data_.size_;
      bVar4 = anon_unknown_0::NormalizeNameTLV(name_tlv,(string *)local_1b8);
      if (bVar4) {
        auVar15 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1b8);
        s_00._M_str = auVar15._8_8_;
        s_00._M_len = (size_t)s_00._M_str;
        SVar14 = StringAsBytes(auVar15._0_8_,s_00);
        der::Input::Input((Input *)&local_1d8,SVar14);
        IVar16 = ParsedCertificate::normalized_issuer(this);
        extensions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)IVar16.data_.data_;
        bVar4 = der::operator!=((Input)local_1d8,IVar16);
        if (bVar4) {
          raw_crl_local._M_str._4_4_ = MAX_VALUE;
          signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
          super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value =
               kRsaPkcs1Sha256;
        }
        else {
          bVar4 = ::std::optional<bssl::der::Input>::has_value
                            ((optional<bssl::der::Input> *)
                             &tbs_cert_list.revoked_certificates_tlv.
                              super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                              super__Optional_payload_base<bssl::der::Input>._M_engaged);
          if (bVar4) {
            ::std::
            map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
            ::map((map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                   *)local_238);
            pSVar8 = &::std::optional<bssl::der::Input>::operator*
                                ((optional<bssl::der::Input> *)
                                 &tbs_cert_list.revoked_certificates_tlv.
                                  super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                                  super__Optional_payload_base<bssl::der::Input>._M_engaged)->data_;
            idp_extension._32_8_ = pSVar8->data_;
            bVar4 = ParseExtensions((Input)*pSVar8,
                                    (map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                                     *)local_238);
            if (bVar4) {
              ParsedExtension::ParsedExtension((ParsedExtension *)&stack0xfffffffffffffd90);
              Span<unsigned_char_const>::Span<3ul>
                        ((Span<unsigned_char_const> *)&distribution_point_names,
                         (uchar (*) [3])&(anonymous_namespace)::kIssuingDistributionPointOid);
              der::Input::Input(&local_280,_distribution_point_names);
              oid.data_.size_ = (size_t)local_238;
              oid.data_.data_ = (uchar *)local_280.data_.size_;
              bVar4 = ConsumeExtension((bssl *)local_280.data_.data_,oid,
                                       (map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                                        *)&stack0xfffffffffffffd90,
                                       (ParsedExtension *)
                                       max_age_seconds_00.super__Optional_base<long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<long>._M_payload);
              if (bVar4) {
                ::std::unique_ptr<bssl::GeneralNames,std::default_delete<bssl::GeneralNames>>::
                unique_ptr<std::default_delete<bssl::GeneralNames>,void>
                          ((unique_ptr<bssl::GeneralNames,std::default_delete<bssl::GeneralNames>> *
                           )(local_29c + 4));
                local_2b8 = idp_extension.oid.data_.size_;
                puStack_2b0 = idp_extension.value.data_.data_;
                extension_value.data_.size_ = (size_t)(local_29c + 4);
                extension_value.data_.data_ = idp_extension.value.data_.data_;
                bVar4 = ParseIssuingDistributionPoint
                                  ((bssl *)idp_extension.oid.data_.size_,extension_value,
                                   (unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                                    *)local_29c,
                                   (ContainedCertsType *)
                                   max_age_seconds_00.super__Optional_base<long,_true,_true>.
                                   _M_payload.super__Optional_payload_base<long>._M_payload);
                if (!bVar4) {
                  raw_crl_local._M_str._4_4_ = MAX_VALUE;
                  signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                  _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload.
                  _M_value = kRsaPkcs1Sha256;
                  goto LAB_005db409;
                }
                bVar4 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)(local_29c + 4));
                if (bVar4) {
                  bVar4 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)cert_dp);
                  local_2d1 = 0;
                  local_439 = 1;
                  if (bVar4) {
                    pGVar9 = ::std::
                             unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                             ::operator->(&cert_dp->distribution_point_fullname);
                    ::std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::vector(&local_2d0,&pGVar9->uniform_resource_identifiers);
                    local_2d1 = 1;
                    pGVar9 = ::std::
                             unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                             ::operator->((unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                                           *)(local_29c + 4));
                    ::std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::vector(&local_2f0,&pGVar9->uniform_resource_identifiers);
                    bVar4 = anon_unknown_0::ContainsExactMatchingName(&local_2d0,&local_2f0);
                    local_439 = bVar4 ^ 0xff;
                    ::std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::~vector(&local_2f0);
                  }
                  if ((local_2d1 & 1) != 0) {
                    ::std::
                    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::~vector(&local_2d0);
                  }
                  if ((local_439 & 1) != 0) {
                    raw_crl_local._M_str._4_4_ = MAX_VALUE;
                    signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                    _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload.
                    _M_value = kRsaPkcs1Sha256;
                    goto LAB_005db409;
                  }
                }
                if (local_29c._0_4_ == 0) {
LAB_005db3ff:
                  signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                  _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload.
                  _M_value = kRsaPkcs1Sha1;
                }
                else if (local_29c._0_4_ == 1) {
                  bVar4 = ParsedCertificate::has_basic_constraints(this);
                  if ((((!bVar4) ||
                       (pPVar10 = ParsedCertificate::basic_constraints(this),
                       (pPVar10->is_ca & 1U) == 0)) &&
                      (pPVar13 = ParsedCertificate::tbs(this), pPVar13->version != V1)) &&
                     (pPVar13 = ParsedCertificate::tbs(this), pPVar13->version != V2))
                  goto LAB_005db3ff;
                  raw_crl_local._M_str._4_4_ = MAX_VALUE;
                  signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                  _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload.
                  _M_value = kRsaPkcs1Sha256;
                }
                else {
                  if ((local_29c._0_4_ != 2) ||
                     ((bVar4 = ParsedCertificate::has_basic_constraints(this), bVar4 &&
                      (pPVar10 = ParsedCertificate::basic_constraints(this),
                      (pPVar10->is_ca & 1U) != 0)))) goto LAB_005db3ff;
                  raw_crl_local._M_str._4_4_ = MAX_VALUE;
                  signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                  _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload.
                  _M_value = kRsaPkcs1Sha256;
                }
LAB_005db409:
                ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::
                ~unique_ptr((unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                             *)(local_29c + 4));
                if (signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                    _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload.
                    _M_value != kRsaPkcs1Sha1) goto LAB_005db4d2;
              }
              __end2 = ::std::
                       map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                       ::begin((map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                                *)local_238);
              ext = (pair<const_bssl::der::Input,_bssl::ParsedExtension> *)
                    ::std::
                    map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                    ::end((map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                           *)local_238);
              while (bVar4 = ::std::operator!=(&__end2,(_Self *)&ext), bVar4) {
                i = (size_t)::std::
                            _Rb_tree_iterator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>
                            ::operator*(&__end2);
                if (((((reference)i)->second).critical & 1U) != 0) {
                  raw_crl_local._M_str._4_4_ = MAX_VALUE;
                  signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                  _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload.
                  _M_value = kRsaPkcs1Sha256;
                  goto LAB_005db4d2;
                }
                ::std::_Rb_tree_iterator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>
                ::operator++(&__end2);
              }
              signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
              _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value
                   = kRsaPkcs1Sha1;
            }
            else {
              raw_crl_local._M_str._4_4_ = MAX_VALUE;
              signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
              _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value
                   = kRsaPkcs1Sha256;
            }
LAB_005db4d2:
            ::std::
            map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
            ::~map((map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                    *)local_238);
            if (signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload.
                _M_value != kRsaPkcs1Sha1) goto LAB_005db7b9;
          }
          for (issuer_cert = (ParsedCertificate *)(target_cert_index + 1); pPVar2 = issuer_cert,
              pPVar11 = (ParsedCertificate *)
                        ::std::
                        vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                        ::size(valid_chain), pPVar2 < pPVar11;
              issuer_cert = (ParsedCertificate *)
                            ((long)&(issuer_cert->cert_data_)._M_t.
                                    super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl +
                            1)) {
            p_Var6 = &::std::
                      vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                      ::operator[](valid_chain,(size_type)issuer_cert)->
                      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>;
            local_328 = ::std::
                        __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::get
                                  (p_Var6);
            auVar15 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)local_1b8);
            s_01._M_str = auVar15._8_8_;
            s_01._M_len = (size_t)s_01._M_str;
            SVar14 = StringAsBytes(auVar15._0_8_,s_01);
            der::Input::Input((Input *)&local_338,SVar14);
            IVar16 = ParsedCertificate::normalized_subject(local_328);
            bVar4 = der::operator!=((Input)local_338,IVar16);
            if (!bVar4) {
              bVar4 = ParsedCertificate::has_key_usage(local_328);
              if (bVar4) {
                pBVar12 = ParsedCertificate::key_usage(local_328);
                bVar4 = der::BitString::AssertsBit(pBVar12,6);
                if (!bVar4) goto LAB_005db791;
              }
              pSVar7 = ::std::optional<bssl::SignatureAlgorithm>::operator*
                                 ((optional<bssl::SignatureAlgorithm> *)&local_150);
              sVar3 = signature_algorithm_tlv.data_.size_;
              SVar1 = *pSVar7;
              pPVar13 = ParsedCertificate::tbs(local_328);
              revoked_certificates_tlv =
                   (optional<bssl::der::Input> *)(pPVar13->spki_tlv).data_.data_;
              signed_data.data_.size_ = (size_t)tbs_cert_list_tlv.data_.data_;
              signed_data.data_.data_ = (uchar *)sVar3;
              bVar4 = VerifySignedData(SVar1,signed_data,(BitString *)local_80,
                                       (Input)(pPVar13->spki_tlv).data_,(SignatureVerifyCache *)0x0)
              ;
              if (bVar4) {
                pPVar13 = ParsedCertificate::tbs(this);
                cert_serial.data_.size_._0_4_ = local_120._0_4_;
                cert_serial.data_.data_ = (uchar *)(pPVar13->serial_number).data_.size_;
                cert_serial.data_.size_._4_4_ = 0;
                raw_crl_local._M_str._4_4_ =
                     GetCRLStatusForCert((bssl *)(pPVar13->serial_number).data_.data_,cert_serial,
                                         (CrlVersion)
                                         &tbs_cert_list.next_update.
                                          super__Optional_base<bssl::der::GeneralizedTime,_true,_true>
                                          ._M_payload.
                                          super__Optional_payload_base<bssl::der::GeneralizedTime>.
                                          _M_engaged,revoked_certificates_tlv);
                signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload.
                _M_value = kRsaPkcs1Sha256;
                goto LAB_005db7b9;
              }
            }
LAB_005db791:
          }
          raw_crl_local._M_str._4_4_ = MAX_VALUE;
          signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
          super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value =
               kRsaPkcs1Sha256;
        }
      }
      else {
        raw_crl_local._M_str._4_4_ = MAX_VALUE;
        signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
        super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value = kRsaPkcs1Sha256
        ;
      }
LAB_005db7b9:
      ::std::__cxx11::string::~string((string *)local_1b8);
      goto LAB_005db7d5;
    }
  }
  raw_crl_local._M_str._4_4_ = MAX_VALUE;
  signature_algorithm.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
  super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload._M_value = kRsaPkcs1Sha256;
LAB_005db7d5:
  ParsedCrlTbsCertList::~ParsedCrlTbsCertList((ParsedCrlTbsCertList *)local_120);
  return raw_crl_local._M_str._4_4_;
}

Assistant:

CRLRevocationStatus CheckCRL(std::string_view raw_crl,
                             const ParsedCertificateList &valid_chain,
                             size_t target_cert_index,
                             const ParsedDistributionPoint &cert_dp,
                             int64_t verify_time_epoch_seconds,
                             std::optional<int64_t> max_age_seconds) {
  BSSL_CHECK(target_cert_index < valid_chain.size());

  if (cert_dp.reasons) {
    // Reason codes are not supported. If the distribution point contains a
    // subset of reasons then skip it. We aren't interested in subsets of CRLs
    // and the RFC states that there MUST be a CRL that covers all reasons.
    return CRLRevocationStatus::UNKNOWN;
  }
  if (cert_dp.crl_issuer) {
    // Indirect CRLs are not supported.
    return CRLRevocationStatus::UNKNOWN;
  }

  const ParsedCertificate *target_cert = valid_chain[target_cert_index].get();

  // 6.3.3 (a) Update the local CRL cache by obtaining a complete CRL, a
  //           delta CRL, or both, as required.
  //
  // This implementation only supports complete CRLs and takes the CRL as
  // input, it is up to the caller to provide an up to date CRL.

  der::Input tbs_cert_list_tlv;
  der::Input signature_algorithm_tlv;
  der::BitString signature_value;
  if (!ParseCrlCertificateList(StringAsBytes(raw_crl), &tbs_cert_list_tlv,
                               &signature_algorithm_tlv, &signature_value)) {
    return CRLRevocationStatus::UNKNOWN;
  }

  ParsedCrlTbsCertList tbs_cert_list;
  if (!ParseCrlTbsCertList(tbs_cert_list_tlv, &tbs_cert_list)) {
    return CRLRevocationStatus::UNKNOWN;
  }

  // 5.1.1.2  signatureAlgorithm
  //
  // TODO(https://crbug.com/749276): Check the signature algorithm against
  // policy.
  std::optional<SignatureAlgorithm> signature_algorithm =
      ParseSignatureAlgorithm(signature_algorithm_tlv);
  if (!signature_algorithm) {
    return CRLRevocationStatus::UNKNOWN;
  }

  //    This field MUST contain the same algorithm identifier as the
  //    signature field in the sequence tbsCertList (Section 5.1.2.2).
  std::optional<SignatureAlgorithm> tbs_alg =
      ParseSignatureAlgorithm(tbs_cert_list.signature_algorithm_tlv);
  if (!tbs_alg || *signature_algorithm != *tbs_alg) {
    return CRLRevocationStatus::UNKNOWN;
  }

  // Check CRL dates. Roughly corresponds to 6.3.3 (a) (1) but does not attempt
  // to update the CRL if it is out of date.
  if (!CheckRevocationDateValid(tbs_cert_list.this_update,
                                tbs_cert_list.next_update.has_value()
                                    ? &tbs_cert_list.next_update.value()
                                    : nullptr,
                                verify_time_epoch_seconds, max_age_seconds)) {
    return CRLRevocationStatus::UNKNOWN;
  }

  // 6.3.3 (a) (2) is skipped: This implementation does not support delta CRLs.

  // 6.3.3 (b) Verify the issuer and scope of the complete CRL as follows:
  // 6.3.3 (b) (1) If the DP includes cRLIssuer, then verify that the issuer
  //               field in the complete CRL matches cRLIssuer in the DP and
  //               that the complete CRL contains an issuing distribution
  //               point extension with the indirectCRL boolean asserted.
  //
  // Nothing is done here since distribution points with crlIssuer were skipped
  // above.

  // 6.3.3 (b) (1) Otherwise, verify that the CRL issuer matches the
  //               certificate issuer.
  //
  // Normalization for the name comparison is used although the RFC is not
  // clear on this. There are several places that explicitly are called out as
  // requiring identical encodings:
  //
  // 4.2.1.13.  CRL Distribution Points (cert extension) says the DP cRLIssuer
  //    field MUST be exactly the same as the encoding in issuer field of the
  //    CRL.
  //
  // 5.2.5.  Issuing Distribution Point (crl extension)
  //    The identical encoding MUST be used in the distributionPoint fields
  //    of the certificate and the CRL.
  //
  // 5.3.3.  Certificate Issuer (crl entry extension) also says "The encoding of
  //    the DN MUST be identical to the encoding used in the certificate"
  //
  // But 6.3.3 (b) (1) just says "matches". Also NIST PKITS includes at least
  // one test that requires normalization here.
  // TODO(https://crbug.com/749276): could do exact comparison first and only
  // fall back to normalizing if that fails.
  std::string normalized_crl_issuer;
  if (!NormalizeNameTLV(tbs_cert_list.issuer_tlv, &normalized_crl_issuer)) {
    return CRLRevocationStatus::UNKNOWN;
  }
  if (der::Input(StringAsBytes(normalized_crl_issuer)) !=
      target_cert->normalized_issuer()) {
    return CRLRevocationStatus::UNKNOWN;
  }

  if (tbs_cert_list.crl_extensions_tlv.has_value()) {
    std::map<der::Input, ParsedExtension> extensions;
    if (!ParseExtensions(*tbs_cert_list.crl_extensions_tlv, &extensions)) {
      return CRLRevocationStatus::UNKNOWN;
    }

    // 6.3.3 (b) (2) If the complete CRL includes an issuing distribution point
    //               (IDP) CRL extension, check the following:
    ParsedExtension idp_extension;
    if (ConsumeExtension(der::Input(kIssuingDistributionPointOid), &extensions,
                         &idp_extension)) {
      std::unique_ptr<GeneralNames> distribution_point_names;
      ContainedCertsType only_contains_cert_type;
      if (!ParseIssuingDistributionPoint(idp_extension.value,
                                         &distribution_point_names,
                                         &only_contains_cert_type)) {
        return CRLRevocationStatus::UNKNOWN;
      }

      if (distribution_point_names) {
        // 6.3.3. (b) (2) (i) If the distribution point name is present in the
        //                    IDP CRL extension and the distribution field is
        //                    present in the DP, then verify that one of the
        //                    names in the IDP matches one of the names in the
        //                    DP.
        // 5.2.5.  The identical encoding MUST be used in the distributionPoint
        //         fields of the certificate and the CRL.
        // TODO(https://crbug.com/749276): Check other name types?
        if (!cert_dp.distribution_point_fullname ||
            !ContainsExactMatchingName(
                cert_dp.distribution_point_fullname
                    ->uniform_resource_identifiers,
                distribution_point_names->uniform_resource_identifiers)) {
          return CRLRevocationStatus::UNKNOWN;
        }

        // 6.3.3. (b) (2) (i) If the distribution point name is present in the
        //                    IDP CRL extension and the distribution field is
        //                    omitted from the DP, then verify that one of the
        //                    names in the IDP matches one of the names in the
        //                    cRLIssuer field of the DP.
        // Indirect CRLs are not supported, if indirectCRL was specified,
        // ParseIssuingDistributionPoint would already have failed.
      }

      switch (only_contains_cert_type) {
        case ContainedCertsType::USER_CERTS:
          // 6.3.3. (b) (2) (ii)  If the onlyContainsUserCerts boolean is
          //                      asserted in the IDP CRL extension, verify
          //                      that the certificate does not include the
          //                      basic constraints extension with the cA
          //                      boolean asserted.
          // 5.2.5.  If either onlyContainsUserCerts or onlyContainsCACerts is
          //         set to TRUE, then the scope of the CRL MUST NOT include any
          //         version 1 or version 2 certificates.
          if ((target_cert->has_basic_constraints() &&
               target_cert->basic_constraints().is_ca) ||
              target_cert->tbs().version == CertificateVersion::V1 ||
              target_cert->tbs().version == CertificateVersion::V2) {
            return CRLRevocationStatus::UNKNOWN;
          }
          break;

        case ContainedCertsType::CA_CERTS:
          // 6.3.3. (b) (2) (iii) If the onlyContainsCACerts boolean is asserted
          //                      in the IDP CRL extension, verify that the
          //                      certificate includes the basic constraints
          //                      extension with the cA boolean asserted.
          // The version check is not done here, as the basicConstraints
          // extension is required, and could not be present unless it is a V3
          // certificate.
          if (!target_cert->has_basic_constraints() ||
              !target_cert->basic_constraints().is_ca) {
            return CRLRevocationStatus::UNKNOWN;
          }
          break;

        case ContainedCertsType::ANY_CERTS:
          //                (iv)  Verify that the onlyContainsAttributeCerts
          //                      boolean is not asserted.
          // If onlyContainsAttributeCerts was present,
          // ParseIssuingDistributionPoint would already have failed.
          break;
      }
    }

    for (const auto &ext : extensions) {
      // Fail if any unhandled critical CRL extensions are present.
      if (ext.second.critical) {
        return CRLRevocationStatus::UNKNOWN;
      }
    }
  }

  // 6.3.3 (c-e) skipped: delta CRLs and reason codes are not supported.

  // This implementation only supports direct CRLs where the CRL was signed by
  // one of the certs in its validated issuer chain. This allows handling some
  // cases of key rollover without requiring additional CRL issuer cert
  // discovery & path building.
  // TODO(https://crbug.com/749276): should this loop start at
  // |target_cert_index|? There doesn't seem to be anything in the specs that
  // precludes a CRL signed by a self-issued cert from covering itself. On the
  // other hand it seems like a pretty weird thing to allow and causes NIST
  // PKITS 4.5.3 to pass when it seems like it would not be intended to (since
  // issuingDistributionPoint CRL extension is not handled).
  for (size_t i = target_cert_index + 1; i < valid_chain.size(); ++i) {
    const ParsedCertificate *issuer_cert = valid_chain[i].get();

    // 6.3.3 (f) Obtain and validate the certification path for the issuer of
    //           the complete CRL.  The trust anchor for the certification
    //           path MUST be the same as the trust anchor used to validate
    //           the target certificate.
    //
    // As the |issuer_cert| is from the already validated chain, it is already
    // known to chain to the same trust anchor as the target certificate.
    if (der::Input(StringAsBytes(normalized_crl_issuer)) !=
        issuer_cert->normalized_subject()) {
      continue;
    }

    // 6.3.3 (f) If a key usage extension is present in the CRL issuer's
    //           certificate, verify that the cRLSign bit is set.
    if (issuer_cert->has_key_usage() &&
        !issuer_cert->key_usage().AssertsBit(KEY_USAGE_BIT_CRL_SIGN)) {
      continue;
    }

    // 6.3.3 (g) Validate the signature on the complete CRL using the public
    //           key validated in step (f).
    if (!VerifySignedData(*signature_algorithm, tbs_cert_list_tlv,
                          signature_value, issuer_cert->tbs().spki_tlv,
                          /*cache=*/nullptr)) {
      continue;
    }

    // 6.3.3 (h,i) skipped. This implementation does not support delta CRLs.

    // 6.3.3 (j) If (cert_status is UNREVOKED), then search for the
    //           certificate on the complete CRL.  If an entry is found that
    //           matches the certificate issuer and serial number as described
    //           in Section 5.3.3, then set the cert_status variable to the
    //           indicated reason as described in step (i).
    //
    // CRL is valid and covers |target_cert|, check if |target_cert| is present
    // in the revokedCertificates sequence.
    return GetCRLStatusForCert(target_cert->tbs().serial_number,
                               tbs_cert_list.version,
                               tbs_cert_list.revoked_certificates_tlv);

    // 6.3.3 (k,l) skipped. This implementation does not support reason codes.
  }

  // Did not find the issuer & signer of |raw_crl| in |valid_chain|.
  return CRLRevocationStatus::UNKNOWN;
}